

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O2

QString * AbstractStringSerialiserPrivate::saveImageVariant
                    (QString *__return_storage_ptr__,QImage *imageData)

{
  QByteArrayView QVar1;
  QBuffer buffer;
  QByteArray byteArray;
  QArrayDataPointer<char> local_40;
  char *local_28;
  QByteArrayView local_20;
  
  byteArray.d.d = (Data *)0x0;
  byteArray.d.ptr = (char *)0x0;
  byteArray.d.size = 0;
  QBuffer::QBuffer(&buffer,(QByteArray *)&byteArray,(QObject *)0x0);
  QImage::save((QIODevice *)imageData,(char *)&buffer,0x14d9c8);
  QByteArray::toBase64(&local_40,&byteArray,0);
  if (local_40.ptr == (char *)0x0) {
    local_40.ptr = (char *)&QByteArray::_empty;
  }
  local_28 = local_40.ptr;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_20,&local_28);
  QVar1.m_data = (storage_type *)local_20.m_size;
  QVar1.m_size = (qsizetype)__return_storage_ptr__;
  QString::fromLatin1(QVar1);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  QBuffer::~QBuffer(&buffer);
  QArrayDataPointer<char>::~QArrayDataPointer(&byteArray.d);
  return __return_storage_ptr__;
}

Assistant:

QString AbstractStringSerialiserPrivate::saveImageVariant(const QImage &imageData)
{
    QByteArray byteArray;
    QBuffer buffer(&byteArray);
    imageData.save(&buffer, "PNG");
    return QString::fromLatin1(byteArray.toBase64().constData());
}